

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O2

TPZGeoMesh * __thiscall
TPZReadTetGen::Process
          (TPZReadTetGen *this,string *NodeFileName,string *FaceFileName,string *TetraFileName)

{
  bool bVar1;
  TPZGeoMesh *this_00;
  ostream *poVar2;
  TPZMultiTimer time;
  string local_a8;
  string local_88;
  string local_68;
  int64_t nvols;
  int64_t nfaces;
  int64_t nnodes;
  
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_00);
  TPZMultiTimer::TPZMultiTimer(&time,4);
  std::__cxx11::string::assign
            ((char *)&(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                       super__Vector_impl_data._M_start)->ProcessName);
  std::__cxx11::string::assign
            ((char *)&time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                      super__Vector_impl_data._M_start[1].ProcessName);
  std::__cxx11::string::assign
            ((char *)&time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                      super__Vector_impl_data._M_start[2].ProcessName);
  std::__cxx11::string::assign
            ((char *)&time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                      super__Vector_impl_data._M_start[3].ProcessName);
  TPZTimer::start(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                  super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_68,(string *)NodeFileName);
  bVar1 = ProcessNodes(this,&local_68,this_00,&nnodes);
  std::__cxx11::string::~string((string *)&local_68);
  TPZTimer::stop(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                 super__Vector_impl_data._M_start);
  if (bVar1) {
    TPZTimer::start(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::string((string *)&local_88,(string *)FaceFileName);
    ProcessFaces(this,&local_88,this_00,&nfaces);
    std::__cxx11::string::~string((string *)&local_88);
    TPZTimer::stop(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
    TPZTimer::start(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 2);
    std::__cxx11::string::string((string *)&local_a8,(string *)TetraFileName);
    ProcessTetra(this,&local_a8,this_00,&nvols);
    std::__cxx11::string::~string((string *)&local_a8);
    TPZTimer::stop(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 2);
    TPZTimer::start(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 3);
    TPZGeoMesh::BuildConnectivity(this_00);
    TPZTimer::stop(time.timers.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 3);
    poVar2 = ::operator<<((ostream *)&std::cout,&time);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    (*(this_00->super_TPZSavable)._vptr_TPZSavable[1])(this_00);
    this_00 = (TPZGeoMesh *)0x0;
  }
  std::vector<TPZTimer,_std::allocator<TPZTimer>_>::~vector(&time.timers);
  return this_00;
}

Assistant:

TPZGeoMesh * TPZReadTetGen::Process(std::string NodeFileName, std::string FaceFileName, std::string TetraFileName) {
	TPZGeoMesh * gmesh = new TPZGeoMesh();
	int64_t nnodes;
	int64_t nfaces, nvols;
	bool check;
	
	TPZMultiTimer time(4);
	time.processName(0) = "Reading nodes";
	time.processName(1) = "Reading faces";
	time.processName(2) = "Reading tetrahedras";
	time.processName(3) = "BuildConnectivity";
	
	time.start(0);
	check = this->ProcessNodes(NodeFileName, *gmesh, nnodes);
	time.stop(0);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(1);
	check = this->ProcessFaces(FaceFileName, *gmesh, nfaces);
	time.stop(1);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(2);
	check = this->ProcessTetra(TetraFileName, *gmesh, nvols);
	time.stop(2);
	if (check == false){
		delete gmesh;
		return NULL;
	}
    
	time.start(3);
	gmesh->BuildConnectivity();
	time.stop(3);
	
	std::cout << time << std::endl;
	
	return gmesh;
	
}